

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void __thiscall ParseUint128_Basic_Test::TestBody(ParseUint128_Basic_Test *this)

{
  char *pcVar1;
  v128 expected;
  v128 expected_00;
  v128 expected_01;
  v128 expected_02;
  v128 expected_03;
  anon_unknown_dwarf_64299 *local_60;
  uint8_t local_58 [8];
  anon_unknown_dwarf_64299 *local_50;
  uint8_t local_48 [8];
  anon_unknown_dwarf_64299 *local_40;
  uint8_t local_38 [8];
  anon_unknown_dwarf_64299 *local_30;
  uint8_t local_28 [8];
  anon_unknown_dwarf_64299 *local_20;
  uint8_t local_18 [8];
  ParseUint128_Basic_Test *local_10;
  ParseUint128_Basic_Test *this_local;
  
  pcVar1 = (char *)0x0;
  local_10 = this;
  v128::v128((v128 *)&local_20,0,0,0,0);
  expected.v._8_8_ = "0";
  expected.v[0] = local_18[0];
  expected.v[1] = local_18[1];
  expected.v[2] = local_18[2];
  expected.v[3] = local_18[3];
  expected.v[4] = local_18[4];
  expected.v[5] = local_18[5];
  expected.v[6] = local_18[6];
  expected.v[7] = local_18[7];
  anon_unknown.dwarf_64299::AssertUint128Equals(local_20,expected,pcVar1);
  pcVar1 = (char *)0x0;
  v128::v128((v128 *)&local_30,1,0,0,0);
  expected_00.v._8_8_ = "1";
  expected_00.v[0] = local_28[0];
  expected_00.v[1] = local_28[1];
  expected_00.v[2] = local_28[2];
  expected_00.v[3] = local_28[3];
  expected_00.v[4] = local_28[4];
  expected_00.v[5] = local_28[5];
  expected_00.v[6] = local_28[6];
  expected_00.v[7] = local_28[7];
  anon_unknown.dwarf_64299::AssertUint128Equals(local_30,expected_00,pcVar1);
  pcVar1 = (char *)0x8070605;
  v128::v128((v128 *)&local_40,0x100f0e0d,0xc0b0a09,0x8070605,0x4030201);
  expected_01.v._8_8_ = "5332529520247008778714484145835150861";
  expected_01.v[0] = local_38[0];
  expected_01.v[1] = local_38[1];
  expected_01.v[2] = local_38[2];
  expected_01.v[3] = local_38[3];
  expected_01.v[4] = local_38[4];
  expected_01.v[5] = local_38[5];
  expected_01.v[6] = local_38[6];
  expected_01.v[7] = local_38[7];
  anon_unknown.dwarf_64299::AssertUint128Equals(local_40,expected_01,pcVar1);
  pcVar1 = (char *)0xffffffff;
  v128::v128((v128 *)&local_50,0xffffffff,0xffffffff,0xffffffff,0xffffffff);
  expected_02.v._8_8_ = "340282366920938463463374607431768211455";
  expected_02.v[0] = local_48[0];
  expected_02.v[1] = local_48[1];
  expected_02.v[2] = local_48[2];
  expected_02.v[3] = local_48[3];
  expected_02.v[4] = local_48[4];
  expected_02.v[5] = local_48[5];
  expected_02.v[6] = local_48[6];
  expected_02.v[7] = local_48[7];
  anon_unknown.dwarf_64299::AssertUint128Equals(local_50,expected_02,pcVar1);
  pcVar1 = (char *)0x1;
  v128::v128((v128 *)&local_60,0,0,1,0);
  expected_03.v._8_8_ = "18446744073709551616";
  expected_03.v[0] = local_58[0];
  expected_03.v[1] = local_58[1];
  expected_03.v[2] = local_58[2];
  expected_03.v[3] = local_58[3];
  expected_03.v[4] = local_58[4];
  expected_03.v[5] = local_58[5];
  expected_03.v[6] = local_58[6];
  expected_03.v[7] = local_58[7];
  anon_unknown.dwarf_64299::AssertUint128Equals(local_60,expected_03,pcVar1);
  return;
}

Assistant:

TEST(ParseUint128, Basic) {
  AssertUint128Equals({0, 0, 0, 0}, "0");
  AssertUint128Equals({1, 0, 0, 0}, "1");
  AssertUint128Equals({0x100f0e0d, 0x0c0b0a09, 0x08070605, 0x04030201},
                      "5332529520247008778714484145835150861");
  AssertUint128Equals({0xffffffff, 0xffffffff, 0xffffffff, 0xffffffff},
                      "340282366920938463463374607431768211455");
  AssertUint128Equals({0, 0, 1, 0}, "18446744073709551616");
}